

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

decimal_fp<double> fmt::v7::detail::dragonbox::to_decimal<double>(double x)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint32_t uVar7;
  unsigned_long uVar8;
  carrier_uint cVar9;
  int in_ESI;
  decimal_fp<double> dVar10;
  double local_1a0;
  double local_190;
  uint local_160;
  undefined4 uStack_15c;
  bool approx_y_parity;
  uint32_t dist;
  uint32_t mask;
  carrier_uint two_fl;
  carrier_uint cStack_148;
  uint32_t r;
  carrier_uint zi;
  carrier_uint two_fr;
  carrier_uint two_fc;
  uint32_t deltai;
  int beta_minus_1;
  cache_entry_type cache;
  int minus_k;
  bool include_right_endpoint;
  bool include_left_endpoint;
  ulong uStack_108;
  int exponent;
  carrier_uint significand;
  carrier_uint significand_mask;
  unsigned_long br;
  double x_local;
  decimal_fp<double> ret_value;
  carrier_uint zi_1;
  carrier_uint xi;
  cache_entry_type cache_1;
  int beta_minus_1_1;
  int minus_k_1;
  decimal_fp<double> ret_value_1;
  uint32_t remainder;
  uint32_t quotient;
  int s;
  uint32_t quotient_1;
  uint64_t quotient_candidate;
  uint64_t max_quotient8;
  uint64_t mod_inv8;
  uint32_t max_quotient1;
  uint32_t mod_inv1;
  int t;
  uint32_t local_54;
  uint32_t remainder_1;
  uint32_t quotient_2;
  int s_1;
  uint32_t quotient_3;
  uint64_t quotient_candidate_1;
  uint64_t max_quotient8_1;
  uint64_t mod_inv8_1;
  uint32_t max_quotient1_1;
  uint32_t mod_inv1_1;
  int t_1;
  uint32_t local_c;
  
  br = (unsigned_long)x;
  uVar8 = bit_cast<unsigned_long,double>((double *)&br);
  uStack_108 = uVar8 & 0xfffffffffffff;
  cVar9 = exponent_mask<double>();
  uVar6 = ((uint)(uVar8 >> 0x20) & (uint)(cVar9 >> 0x20)) >> 0x14;
  if (uVar6 == 0) {
    if (uStack_108 == 0) {
      x_local = 0.0;
      ret_value.significand._0_4_ = 0;
      goto LAB_00347f2e;
    }
    minus_k = -0x432;
  }
  else {
    minus_k = uVar6 - 0x433;
    if (uStack_108 == 0) {
      ret_value_1.significand._0_4_ = floor_log10_pow2_minus_log10_4_over_3(minus_k);
      iVar5 = floor_log2_pow10(-(int)ret_value_1.significand);
      cache_1.internal_._12_4_ = minus_k + iVar5;
      xi = (carrier_uint)
           cache_accessor<double>::get_cached_power
                     ((uint128_wrapper *)(ulong)(uint)-(int)ret_value_1.significand,in_ESI);
      zi_1 = cache_accessor<double>::compute_left_endpoint_for_shorter_interval_case
                       ((cache_entry_type *)&xi,cache_1.internal_._12_4_);
      ret_value._8_8_ =
           cache_accessor<double>::compute_right_endpoint_for_shorter_interval_case
                     ((cache_entry_type *)&xi,cache_1.internal_._12_4_);
      bVar4 = is_left_endpoint_integer_shorter_interval<double>(minus_k);
      if (!bVar4) {
        zi_1 = zi_1 + 1;
      }
      _minus_k_1 = (double)((ulong)ret_value._8_8_ / 10);
      if ((ulong)((long)_minus_k_1 * 10) < zi_1) {
        local_190 = (double)cache_accessor<double>::compute_round_up_for_shorter_interval_case
                                      ((cache_entry_type *)&xi,cache_1.internal_._12_4_);
        if ((minus_k < -0x4d) || (-0x4d < minus_k)) {
          _minus_k_1 = local_190;
          if ((ulong)local_190 < zi_1) {
            _minus_k_1 = (double)((long)local_190 + 1);
          }
        }
        else {
          if (((ulong)local_190 & 1) != 0) {
            local_190 = (double)((long)local_190 - 1);
          }
          _minus_k_1 = local_190;
        }
      }
      else {
        max_quotient1 = 0;
        for (dVar3 = _minus_k_1; ((ulong)dVar3 & 1) == 0;
            dVar3 = (double)((ulong)dVar3 >> 1 | 0x8000000000000000)) {
          max_quotient1 = max_quotient1 + 1;
        }
        if (0x10 < (int)max_quotient1) {
          max_quotient1 = 0x10;
        }
        if (((int)max_quotient1 < 8) ||
           (0x2af31dc46118 < (ulong)((long)_minus_k_1 * -0x3898f8b4dd16f1df))) {
          auVar1._8_8_ = 0;
          auVar1._0_8_ = _minus_k_1;
          uVar6 = SUB164(auVar1 / ZEXT816(100000000),0);
          iVar5 = SUB84(_minus_k_1,0) + uVar6 * -100000000;
          if ((max_quotient1 == 0) || (0x33333333 < (uint)(iVar5 * -0x33333333))) {
            local_54 = 0;
          }
          else if ((max_quotient1 == 1) || (0x33333333 < (uint)(iVar5 * -0x3d70a3d7))) {
            _minus_k_1 = (double)((ulong)((uint)(iVar5 * -0x33333333) >> 1) +
                                 (ulong)uVar6 * 10000000);
            local_54 = 1;
          }
          else if ((max_quotient1 == 2) || (0x33333333 < (uint)(iVar5 * 0x26e978d5))) {
            _minus_k_1 = (double)((ulong)((uint)(iVar5 * -0x3d70a3d7) >> 2) + (ulong)uVar6 * 1000000
                                 );
            local_54 = 2;
          }
          else if ((max_quotient1 == 3) || (0x33333333 < (uint)(iVar5 * 0x3afb7e91))) {
            _minus_k_1 = (double)((ulong)((uint)(iVar5 * 0x26e978d5) >> 3) + (ulong)uVar6 * 100000);
            local_54 = 3;
          }
          else if ((max_quotient1 == 4) || (0x33333333 < (uint)(iVar5 * 0xbcbe61d))) {
            _minus_k_1 = (double)((ulong)((uint)(iVar5 * 0x3afb7e91) >> 4) + (ulong)uVar6 * 10000);
            local_54 = 4;
          }
          else if ((max_quotient1 == 5) || (0x33333333 < (uint)(iVar5 * 0x68c26139))) {
            _minus_k_1 = (double)((ulong)((uint)(iVar5 * 0xbcbe61d) >> 5) + (ulong)uVar6 * 1000);
            local_54 = 5;
          }
          else if ((max_quotient1 == 6) || (0x33333333 < (uint)(iVar5 * -0x5172b95b))) {
            _minus_k_1 = (double)((ulong)((uint)(iVar5 * 0x68c26139) >> 6) + (ulong)uVar6 * 100);
            local_54 = 6;
          }
          else {
            _minus_k_1 = (double)((ulong)((uint)(iVar5 * -0x5172b95b) >> 7) + (ulong)uVar6 * 10);
            local_54 = 7;
          }
        }
        else {
          remainder = 8;
          for (quotient = (uint32_t)((ulong)((long)_minus_k_1 * -0x3898f8b4dd16f1df) >> 8);
              ((int)remainder < (int)max_quotient1 && (quotient * -0x33333333 < 0x33333334));
              quotient = quotient * -0x33333333) {
            remainder = remainder + 1;
          }
          _minus_k_1 = (double)(ulong)(quotient >> ((char)remainder - 8U & 0x1f));
          local_54 = remainder;
        }
        ret_value_1.significand._0_4_ = local_54 + (int)ret_value_1.significand + 1;
      }
      x_local = _minus_k_1;
      ret_value.significand._0_4_ = (int)ret_value_1.significand;
      goto LAB_00347f2e;
    }
    uStack_108 = uStack_108 | 0x10000000000000;
  }
  bVar4 = (uStack_108 & 1) != 0;
  iVar5 = floor_log10_pow2(minus_k);
  cache.internal_._12_4_ = iVar5 + -2;
  _deltai = cache_accessor<double>::get_cached_power
                      ((uint128_wrapper *)(ulong)(uint)-cache.internal_._12_4_,in_ESI);
  iVar5 = floor_log2_pow10(-cache.internal_._12_4_);
  two_fc._4_4_ = minus_k + iVar5;
  two_fc._0_4_ = cache_accessor<double>::compute_delta((cache_entry_type *)&deltai,two_fc._4_4_);
  two_fr = uStack_108 << 1;
  zi = two_fr | 1;
  cStack_148 = cache_accessor<double>::compute_mul
                         (zi << ((byte)two_fc._4_4_ & 0x3f),(cache_entry_type *)&deltai);
  x_local = (double)divide_by_10_to_kappa_plus_1(cStack_148);
  two_fl._4_4_ = (int)cStack_148 + SUB84(x_local,0) * -1000;
  if ((uint32_t)two_fc < two_fl._4_4_) {
LAB_00347db1:
    x_local = (double)((long)x_local * 10);
    ret_value.significand._0_4_ = cache.internal_._12_4_ + 2;
    uStack_15c = 3;
    local_160 = (two_fl._4_4_ - ((uint32_t)two_fc >> 1)) + 0x32;
    if ((local_160 & 3) == 0) {
      uVar6 = local_160 & 1;
      local_160 = local_160 >> 2;
      bVar4 = check_divisibility_and_divide_by_pow5<2>(&local_160);
      if (bVar4) {
        x_local = (double)((ulong)local_160 + (long)x_local);
        bVar4 = cache_accessor<double>::compute_mul_parity
                          (two_fr,(cache_entry_type *)&deltai,two_fc._4_4_);
        if (bVar4 == (uVar6 != 0)) {
          bVar4 = is_center_integer<double>(two_fr,minus_k,cache.internal_._12_4_);
          if (bVar4) {
            if (((ulong)x_local & 1) == 0) {
              local_1a0 = x_local;
            }
            else {
              local_1a0 = (double)((long)x_local + -1);
            }
            x_local = local_1a0;
          }
        }
        else {
          x_local = (double)((long)x_local + -1);
        }
      }
      else {
        x_local = (double)((ulong)local_160 + (long)x_local);
      }
    }
    else {
      uVar7 = small_division_by_pow10<2>(local_160);
      x_local = (double)((ulong)uVar7 + (long)x_local);
    }
  }
  else {
    if (two_fl._4_4_ < (uint32_t)two_fc) {
      if (((two_fl._4_4_ == 0) && (bVar4)) &&
         (bVar4 = is_endpoint_integer<double>(zi,minus_k,cache.internal_._12_4_), bVar4)) {
        x_local = (double)((long)x_local + -1);
        two_fl._4_4_ = 1000;
        goto LAB_00347db1;
      }
    }
    else {
      _dist = two_fr - 1;
      if (((bVar4) ||
          (bVar4 = is_endpoint_integer<double>(_dist,minus_k,cache.internal_._12_4_), !bVar4)) &&
         (bVar4 = cache_accessor<double>::compute_mul_parity
                            (_dist,(cache_entry_type *)&deltai,two_fc._4_4_), !bVar4))
      goto LAB_00347db1;
    }
    max_quotient1_1 = 0;
    for (dVar3 = x_local; ((ulong)dVar3 & 1) == 0;
        dVar3 = (double)((ulong)dVar3 >> 1 | 0x8000000000000000)) {
      max_quotient1_1 = max_quotient1_1 + 1;
    }
    if (0x10 < (int)max_quotient1_1) {
      max_quotient1_1 = 0x10;
    }
    if (((int)max_quotient1_1 < 8) ||
       (0x2af31dc46118 < (ulong)((long)x_local * -0x3898f8b4dd16f1df))) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = x_local;
      uVar6 = SUB164(auVar2 / ZEXT816(100000000),0);
      iVar5 = SUB84(x_local,0) + uVar6 * -100000000;
      if ((max_quotient1_1 == 0) || (0x33333333 < (uint)(iVar5 * -0x33333333))) {
        local_c = 0;
      }
      else if ((max_quotient1_1 == 1) || (0x33333333 < (uint)(iVar5 * -0x3d70a3d7))) {
        x_local = (double)((ulong)((uint)(iVar5 * -0x33333333) >> 1) + (ulong)uVar6 * 10000000);
        local_c = 1;
      }
      else if ((max_quotient1_1 == 2) || (0x33333333 < (uint)(iVar5 * 0x26e978d5))) {
        x_local = (double)((ulong)((uint)(iVar5 * -0x3d70a3d7) >> 2) + (ulong)uVar6 * 1000000);
        local_c = 2;
      }
      else if ((max_quotient1_1 == 3) || (0x33333333 < (uint)(iVar5 * 0x3afb7e91))) {
        x_local = (double)((ulong)((uint)(iVar5 * 0x26e978d5) >> 3) + (ulong)uVar6 * 100000);
        local_c = 3;
      }
      else if ((max_quotient1_1 == 4) || (0x33333333 < (uint)(iVar5 * 0xbcbe61d))) {
        x_local = (double)((ulong)((uint)(iVar5 * 0x3afb7e91) >> 4) + (ulong)uVar6 * 10000);
        local_c = 4;
      }
      else if ((max_quotient1_1 == 5) || (0x33333333 < (uint)(iVar5 * 0x68c26139))) {
        x_local = (double)((ulong)((uint)(iVar5 * 0xbcbe61d) >> 5) + (ulong)uVar6 * 1000);
        local_c = 5;
      }
      else if ((max_quotient1_1 == 6) || (0x33333333 < (uint)(iVar5 * -0x5172b95b))) {
        x_local = (double)((ulong)((uint)(iVar5 * 0x68c26139) >> 6) + (ulong)uVar6 * 100);
        local_c = 6;
      }
      else {
        x_local = (double)((ulong)((uint)(iVar5 * -0x5172b95b) >> 7) + (ulong)uVar6 * 10);
        local_c = 7;
      }
    }
    else {
      remainder_1 = 8;
      for (quotient_2 = (uint32_t)((ulong)((long)x_local * -0x3898f8b4dd16f1df) >> 8);
          ((int)remainder_1 < (int)max_quotient1_1 && (quotient_2 * -0x33333333 < 0x33333334));
          quotient_2 = quotient_2 * -0x33333333) {
        remainder_1 = remainder_1 + 1;
      }
      x_local = (double)(ulong)(quotient_2 >> ((char)remainder_1 - 8U & 0x1f));
      local_c = remainder_1;
    }
    ret_value.significand._0_4_ = local_c + cache.internal_._12_4_ + 3;
  }
LAB_00347f2e:
  dVar10.exponent = (int)ret_value.significand;
  dVar10.significand = (significand_type)x_local;
  dVar10._12_4_ = 0;
  return dVar10;
}

Assistant:

FMT_SAFEBUFFERS decimal_fp<T> to_decimal(T x) FMT_NOEXCEPT {
  // Step 1: integer promotion & Schubfach multiplier calculation.

  using carrier_uint = typename float_info<T>::carrier_uint;
  using cache_entry_type = typename cache_accessor<T>::cache_entry_type;
  auto br = bit_cast<carrier_uint>(x);

  // Extract significand bits and exponent bits.
  const carrier_uint significand_mask =
      (static_cast<carrier_uint>(1) << float_info<T>::significand_bits) - 1;
  carrier_uint significand = (br & significand_mask);
  int exponent = static_cast<int>((br & exponent_mask<T>()) >>
                                  float_info<T>::significand_bits);

  if (exponent != 0) {  // Check if normal.
    exponent += float_info<T>::exponent_bias - float_info<T>::significand_bits;

    // Shorter interval case; proceed like Schubfach.
    if (significand == 0) return shorter_interval_case<T>(exponent);

    significand |=
        (static_cast<carrier_uint>(1) << float_info<T>::significand_bits);
  } else {
    // Subnormal case; the interval is always regular.
    if (significand == 0) return {0, 0};
    exponent = float_info<T>::min_exponent - float_info<T>::significand_bits;
  }

  const bool include_left_endpoint = (significand % 2 == 0);
  const bool include_right_endpoint = include_left_endpoint;

  // Compute k and beta.
  const int minus_k = floor_log10_pow2(exponent) - float_info<T>::kappa;
  const cache_entry_type cache = cache_accessor<T>::get_cached_power(-minus_k);
  const int beta_minus_1 = exponent + floor_log2_pow10(-minus_k);

  // Compute zi and deltai
  // 10^kappa <= deltai < 10^(kappa + 1)
  const uint32_t deltai = cache_accessor<T>::compute_delta(cache, beta_minus_1);
  const carrier_uint two_fc = significand << 1;
  const carrier_uint two_fr = two_fc | 1;
  const carrier_uint zi =
      cache_accessor<T>::compute_mul(two_fr << beta_minus_1, cache);

  // Step 2: Try larger divisor; remove trailing zeros if necessary

  // Using an upper bound on zi, we might be able to optimize the division
  // better than the compiler; we are computing zi / big_divisor here
  decimal_fp<T> ret_value;
  ret_value.significand = divide_by_10_to_kappa_plus_1(zi);
  uint32_t r = static_cast<uint32_t>(zi - float_info<T>::big_divisor *
                                              ret_value.significand);

  if (r > deltai) {
    goto small_divisor_case_label;
  } else if (r < deltai) {
    // Exclude the right endpoint if necessary
    if (r == 0 && !include_right_endpoint &&
        is_endpoint_integer<T>(two_fr, exponent, minus_k)) {
      --ret_value.significand;
      r = float_info<T>::big_divisor;
      goto small_divisor_case_label;
    }
  } else {
    // r == deltai; compare fractional parts
    // Check conditions in the order different from the paper
    // to take advantage of short-circuiting
    const carrier_uint two_fl = two_fc - 1;
    if ((!include_left_endpoint ||
         !is_endpoint_integer<T>(two_fl, exponent, minus_k)) &&
        !cache_accessor<T>::compute_mul_parity(two_fl, cache, beta_minus_1)) {
      goto small_divisor_case_label;
    }
  }
  ret_value.exponent = minus_k + float_info<T>::kappa + 1;

  // We may need to remove trailing zeros
  ret_value.exponent += remove_trailing_zeros(ret_value.significand);
  return ret_value;

  // Step 3: Find the significand with the smaller divisor

small_divisor_case_label:
  ret_value.significand *= 10;
  ret_value.exponent = minus_k + float_info<T>::kappa;

  const uint32_t mask = (1u << float_info<T>::kappa) - 1;
  auto dist = r - (deltai / 2) + (float_info<T>::small_divisor / 2);

  // Is dist divisible by 2^kappa?
  if ((dist & mask) == 0) {
    const bool approx_y_parity =
        ((dist ^ (float_info<T>::small_divisor / 2)) & 1) != 0;
    dist >>= float_info<T>::kappa;

    // Is dist divisible by 5^kappa?
    if (check_divisibility_and_divide_by_pow5<float_info<T>::kappa>(dist)) {
      ret_value.significand += dist;

      // Check z^(f) >= epsilon^(f)
      // We have either yi == zi - epsiloni or yi == (zi - epsiloni) - 1,
      // where yi == zi - epsiloni if and only if z^(f) >= epsilon^(f)
      // Since there are only 2 possibilities, we only need to care about the
      // parity. Also, zi and r should have the same parity since the divisor
      // is an even number
      if (cache_accessor<T>::compute_mul_parity(two_fc, cache, beta_minus_1) !=
          approx_y_parity) {
        --ret_value.significand;
      } else {
        // If z^(f) >= epsilon^(f), we might have a tie
        // when z^(f) == epsilon^(f), or equivalently, when y is an integer
        if (is_center_integer<T>(two_fc, exponent, minus_k)) {
          ret_value.significand = ret_value.significand % 2 == 0
                                      ? ret_value.significand
                                      : ret_value.significand - 1;
        }
      }
    }
    // Is dist not divisible by 5^kappa?
    else {
      ret_value.significand += dist;
    }
  }
  // Is dist not divisible by 2^kappa?
  else {
    // Since we know dist is small, we might be able to optimize the division
    // better than the compiler; we are computing dist / small_divisor here
    ret_value.significand +=
        small_division_by_pow10<float_info<T>::kappa>(dist);
  }
  return ret_value;
}